

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O3

int sp_cgemv(char *trans,singlecomplex alpha,SuperMatrix *A,singlecomplex *x,int incx,
            singlecomplex beta,singlecomplex *y,int incy)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  singlecomplex sVar6;
  singlecomplex sVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  singlecomplex *psVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar27;
  float fVar28;
  singlecomplex sVar25;
  singlecomplex sVar26;
  singlecomplex sVar29;
  char msg [256];
  int local_138 [66];
  
  fVar27 = beta.r;
  fVar23 = beta.i;
  fVar21 = alpha.r;
  fVar22 = alpha.i;
  bVar10 = *trans + 0xbd;
  if ((bVar10 < 0x2c) && ((0x80000020801U >> ((ulong)bVar10 & 0x3f) & 1) != 0)) {
    uVar20 = 0xffffffdfffe >> (bVar10 & 0x3f);
    uVar9 = A->nrow;
    if (-1 < (int)uVar9) {
      uVar1 = A->ncol;
      lVar16 = (long)(int)uVar1;
      if (-1 < lVar16) {
        if (incx == 0) {
          local_138[0] = 5;
        }
        else {
          if (incy != 0) {
            if (uVar1 == 0 || uVar9 == 0) {
              return 0;
            }
            pvVar3 = A->Store;
            lVar4 = *(long *)((long)pvVar3 + 8);
            if ((((fVar21 == 0.0 && fVar22 == 0.0) && (fVar27 == 1.0)) && (!NAN(fVar27))) &&
               ((fVar23 == 0.0 && (!NAN(fVar23))))) {
              return 0;
            }
            uVar8 = uVar1;
            if ((uVar20 & 1) == 0) {
              uVar8 = uVar9;
              uVar9 = uVar1;
            }
            uVar1 = (1 - uVar8) * incx;
            if (0 < incx) {
              uVar1 = 0;
            }
            uVar19 = (ulong)uVar1;
            uVar1 = (1 - uVar9) * incy;
            if (0 < incy) {
              uVar1 = 0;
            }
            if (((fVar27 != 1.0) || (NAN(fVar27))) || ((fVar23 != 0.0 || (NAN(fVar23))))) {
              if (incy == 1) {
                if (fVar27 != 0.0 || fVar23 != 0.0) {
                  uVar12 = 0;
                  do {
                    sVar6.i = y[uVar12].r * fVar23 + y[uVar12].i * fVar27;
                    sVar6.r = y[uVar12].r * fVar27 + y[uVar12].i * -fVar23;
                    y[uVar12] = sVar6;
                    uVar12 = uVar12 + 1;
                  } while (uVar9 != uVar12);
                }
                else {
                  memset(y,0,(ulong)uVar9 << 3);
                }
              }
              else if (fVar27 != 0.0 || fVar23 != 0.0) {
                psVar15 = y + (int)uVar1;
                do {
                  sVar7.i = psVar15->r * fVar23 + psVar15->i * fVar27;
                  sVar7.r = psVar15->r * fVar27 + psVar15->i * -fVar23;
                  *psVar15 = sVar7;
                  psVar15 = psVar15 + incy;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              else {
                psVar15 = y + (int)uVar1;
                do {
                  psVar15->r = 0.0;
                  psVar15->i = 0.0;
                  psVar15 = psVar15 + incy;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
            }
            if (fVar21 == 0.0 && fVar22 == 0.0) {
              return 0;
            }
            if ((uVar20 & 1) == 0) {
              if ((byte)(*trans | 0x20U) == 0x74) {
                if (incx == 1) {
                  piVar5 = *(int **)((long)pvVar3 + 0x18);
                  lVar11 = (long)(int)uVar1;
                  lVar14 = 0;
                  iVar17 = *piVar5;
                  do {
                    iVar2 = piVar5[lVar14 + 1];
                    fVar27 = 0.0;
                    fVar23 = 0.0;
                    if (iVar17 < iVar2) {
                      lVar18 = (long)iVar17;
                      do {
                        iVar17 = *(int *)(*(long *)((long)pvVar3 + 0x10) + lVar18 * 4);
                        uVar13 = *(undefined8 *)(lVar4 + lVar18 * 8);
                        fVar24 = (float)uVar13;
                        fVar28 = (float)((ulong)uVar13 >> 0x20);
                        fVar27 = fVar27 + x[iVar17].r * fVar24 + -fVar28 * x[iVar17].i;
                        fVar23 = fVar23 + x[iVar17].r * fVar28 + fVar24 * x[iVar17].i;
                        lVar18 = lVar18 + 1;
                      } while (iVar2 != lVar18);
                    }
                    lVar14 = lVar14 + 1;
                    sVar25.r = y[lVar11].r + fVar27 * fVar21 + fVar23 * -fVar22;
                    sVar25.i = y[lVar11].i + fVar27 * fVar22 + fVar23 * fVar21;
                    y[lVar11] = sVar25;
                    lVar11 = lVar11 + incy;
                    iVar17 = iVar2;
                  } while (lVar14 != lVar16);
                  return 0;
                }
                uVar13 = 0x23d;
              }
              else {
                if (incx == 1) {
                  piVar5 = *(int **)((long)pvVar3 + 0x18);
                  lVar11 = (long)(int)uVar1;
                  lVar14 = 0;
                  iVar17 = *piVar5;
                  do {
                    iVar2 = piVar5[lVar14 + 1];
                    fVar27 = 0.0;
                    fVar23 = 0.0;
                    if (iVar17 < iVar2) {
                      lVar18 = (long)iVar17;
                      do {
                        iVar17 = *(int *)(*(long *)((long)pvVar3 + 0x10) + lVar18 * 4);
                        uVar13 = *(undefined8 *)(lVar4 + lVar18 * 8);
                        fVar24 = (float)uVar13;
                        fVar28 = (float)((ulong)uVar13 >> 0x20);
                        fVar27 = fVar27 + x[iVar17].r * -fVar28 + x[iVar17].i * fVar24;
                        fVar23 = fVar23 + x[iVar17].r * fVar24 + x[iVar17].i * fVar28;
                        lVar18 = lVar18 + 1;
                      } while (iVar2 != lVar18);
                    }
                    lVar14 = lVar14 + 1;
                    sVar26.r = y[lVar11].r + fVar23 * fVar21 + fVar27 * -fVar22;
                    sVar26.i = y[lVar11].i + fVar23 * fVar22 + fVar27 * fVar21;
                    y[lVar11] = sVar26;
                    lVar11 = lVar11 + incy;
                    iVar17 = iVar2;
                  } while (lVar14 != lVar16);
                  return 0;
                }
                uVar13 = 0x252;
              }
            }
            else {
              if (incy == 1) {
                lVar11 = 0;
                do {
                  fVar27 = x[uVar19].r;
                  fVar23 = x[uVar19].i;
                  if ((((fVar27 != 0.0) || (NAN(fVar27))) || (fVar23 != 0.0)) || (NAN(fVar23))) {
                    iVar17 = *(int *)(*(long *)((long)pvVar3 + 0x18) + lVar11 * 4);
                    lVar14 = (long)iVar17;
                    iVar2 = *(int *)(*(long *)((long)pvVar3 + 0x18) + 4 + lVar11 * 4);
                    if (iVar17 < iVar2) {
                      fVar24 = fVar27 * fVar21 + fVar23 * -fVar22;
                      fVar27 = fVar27 * fVar22 + fVar23 * fVar21;
                      lVar18 = *(long *)((long)pvVar3 + 0x10);
                      do {
                        iVar17 = *(int *)(lVar18 + lVar14 * 4);
                        fVar23 = *(float *)(lVar4 + lVar14 * 8);
                        fVar28 = *(float *)(lVar4 + 4 + lVar14 * 8);
                        sVar29.r = y[iVar17].r + fVar23 * fVar24 + fVar28 * -fVar27;
                        sVar29.i = y[iVar17].i + fVar23 * fVar27 + fVar28 * fVar24;
                        y[iVar17] = sVar29;
                        lVar14 = lVar14 + 1;
                      } while (iVar2 != lVar14);
                    }
                  }
                  uVar19 = uVar19 + (long)incx;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar16);
                return 0;
              }
              uVar13 = 0x22b;
            }
            sprintf((char *)local_138,"%s at line %d in file %s\n","Not implemented.",uVar13,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                   );
            superlu_abort_and_exit((char *)local_138);
            return 0;
          }
          local_138[0] = 8;
        }
        goto LAB_00104c8e;
      }
    }
    local_138[0] = 3;
  }
  else {
    local_138[0] = 1;
  }
LAB_00104c8e:
  input_error("sp_cgemv ",local_138);
  return 0;
}

Assistant:

int
sp_cgemv(char *trans, singlecomplex alpha, SuperMatrix *A, singlecomplex *x, 
	 int incx, singlecomplex beta, singlecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int info;
    singlecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    singlecomplex comp_zero = {0.0, 0.0};
    singlecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_cgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (c_eq(&alpha, &comp_zero) && c_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !c_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  cc_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    cc_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( c_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !c_eq(&x[jx], &comp_zero) ) {
		    cc_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			cc_mult(&temp1, &temp,  &Aval[i]);
			c_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    cc_mult(&temp1, &Aval[i], &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	singlecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    cc_mult(&temp1, &temp2, &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}